

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O3

int ffgcdw(fitsfile *fptr,int colnum,int *width,int *status)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ushort **ppuVar6;
  char *pcVar7;
  bool bVar8;
  int tstatus;
  char dispfmt [20];
  long rwidth;
  long repeat;
  int gstatus;
  int typecode;
  int hdutype;
  double tscale;
  char message [81];
  undefined4 local_cc;
  byte local_c8 [24];
  ulong local_b0;
  long local_a8;
  int local_9c;
  int local_98;
  int local_94;
  double local_90;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    snprintf(local_88,0x51,"Specified column number is out of range: %d",(ulong)(uint)colnum);
    ffpmsg(local_88);
    *status = 0x12e;
    return 0x12e;
  }
  uVar5 = fptr->Fptr->tableptr[(ulong)(uint)colnum - 1].tdatatype;
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  ffkeyn("TDISP",colnum,local_88,status);
  *width = 0;
  local_cc = 0;
  iVar4 = ffgkys(fptr,local_88,(char *)local_c8,(char *)0x0,&local_cc);
  if (iVar4 == 0) {
    for (pcVar7 = (char *)((long)&local_cc + 3); (byte)pcVar7[1] == 0x20; pcVar7 = pcVar7 + 1) {
    }
    uVar5 = (byte)pcVar7[1] - 0x41;
    if ((0x39 < uVar5) || ((0x200417902004179U >> ((ulong)uVar5 & 0x3f) & 1) == 0))
    goto LAB_001a1075;
    ppuVar6 = __ctype_b_loc();
    do {
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
      if ((long)*pcVar1 == 0) break;
    } while (((*ppuVar6)[*pcVar1] & 0x800) == 0);
    iVar4 = atoi(pcVar7);
    *width = iVar4;
    if (uVar3 < 0x53) goto LAB_001a10e9;
    iVar4 = iVar4 * 2 + 3;
LAB_001a10e1:
    *width = iVar4;
  }
  else {
LAB_001a1075:
    iVar4 = *width;
LAB_001a10e9:
    if (iVar4 != 0) goto LAB_001a11a6;
    ffkeyn("TFORM",colnum,local_88,status);
    ffgkys(fptr,local_88,(char *)local_c8,(char *)0x0,status);
    ffkeyn("TSCAL",colnum,local_88,status);
    local_cc = 0;
    iVar4 = ffgkyd(fptr,local_88,&local_90,(char *)0x0,&local_cc);
    bVar8 = iVar4 == 0;
    bVar2 = local_90 != 1.0;
    if ((bVar2 && bVar8) && (uVar3 < 0x16)) {
LAB_001a117b:
      *width = 0xe;
      goto LAB_001a11a6;
    }
    if ((uVar3 != 0x29 || (!bVar2 || !bVar8)) && ((!bVar2 || !bVar8) || uVar3 != 0x51)) {
      ffghdt(fptr,&local_94,status);
      if (local_94 == 1) {
        ppuVar6 = __ctype_b_loc();
        pcVar7 = (char *)((long)&local_cc + 3);
        do {
          pcVar1 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
          if ((long)*pcVar1 == 0) break;
        } while (((*ppuVar6)[*pcVar1] & 0x800) == 0);
        iVar4 = atoi(pcVar7);
        goto LAB_001a10e1;
      }
      if (uVar3 == 0x15) {
        *width = 6;
        goto LAB_001a11a6;
      }
      if (uVar3 == 0xb) {
        *width = 4;
        goto LAB_001a11a6;
      }
      if (uVar3 == 1) {
        *width = 8;
        goto LAB_001a11a6;
      }
      if (uVar3 == 0x29) {
        *width = 0xb;
        goto LAB_001a11a6;
      }
      if (uVar3 == 0x51) {
        *width = 0x14;
        goto LAB_001a11a6;
      }
      if ((int)uVar3 < 0x52) {
        if (uVar3 == 0xe) {
          *width = 1;
          goto LAB_001a11a6;
        }
        if (uVar3 == 0x10) {
          local_a8 = 0;
          local_b0 = 0;
          local_9c = 0;
          iVar4 = ffgtcl(fptr,colnum,&local_98,&local_a8,(long *)&local_b0,&local_9c);
          if (((iVar4 != 0) || ((long)local_b0 < 1)) || (local_a8 <= (long)local_b0)) {
            ppuVar6 = __ctype_b_loc();
            pcVar7 = (char *)((long)&local_cc + 3);
            do {
              pcVar1 = pcVar7 + 1;
              pcVar7 = pcVar7 + 1;
              if ((long)*pcVar1 == 0) break;
            } while (((*ppuVar6)[*pcVar1] & 0x800) == 0);
            uVar5 = atoi(pcVar7);
            local_b0 = (ulong)uVar5;
          }
          iVar4 = 1;
          if (1 < (int)local_b0) {
            iVar4 = (int)local_b0;
          }
          *width = iVar4;
          goto LAB_001a11a6;
        }
        if (uVar3 != 0x2a) goto LAB_001a11a6;
        goto LAB_001a117b;
      }
      if (uVar3 != 0x52) {
        if (uVar3 == 0x53) {
          *width = 0x1f;
        }
        else if (uVar3 == 0xa3) {
          *width = 0x31;
        }
        goto LAB_001a11a6;
      }
    }
    *width = 0x17;
  }
LAB_001a11a6:
  return *status;
}

Assistant:

int ffgcdw( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column (1 = 1st col)      */
            int  *width,      /* O - display width                       */
            int  *status)     /* IO - error status                           */
/*
  Get Column Display Width.
*/
{
    tcolumn *colptr;
    char *cptr;
    char message[FLEN_ERRMSG], keyname[FLEN_KEYWORD], dispfmt[20];
    int tcode, hdutype, tstatus, scaled;
    double tscale;

    if (*status > 0)  /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = abs(colptr->tdatatype);

    /* use the TDISPn keyword if it exists */
    ffkeyn("TDISP", colnum, keyname, status);

    *width = 0;
    tstatus = 0;
    if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
    {
          /* parse TDISPn get the display width */
          cptr = dispfmt;
          while(*cptr == ' ') /* skip leading blanks */
              cptr++;

          if (*cptr == 'A' || *cptr == 'a' ||
              *cptr == 'I' || *cptr == 'i' ||
              *cptr == 'O' || *cptr == 'o' ||
              *cptr == 'Z' || *cptr == 'z' ||
              *cptr == 'F' || *cptr == 'f' ||
              *cptr == 'E' || *cptr == 'e' ||
              *cptr == 'D' || *cptr == 'd' ||
              *cptr == 'G' || *cptr == 'g')
          {

            while(!isdigit((int) *cptr) && *cptr != '\0') /* find 1st digit */
              cptr++;

            *width = atoi(cptr);
            if (tcode >= TCOMPLEX)
              *width = (2 * (*width)) + 3;
          }
    }

    if (*width == 0)
    {
        /* no valid TDISPn keyword; use TFORMn instead */

        ffkeyn("TFORM", colnum, keyname, status);
        ffgkys(fptr, keyname, dispfmt, NULL, status);

        /* check if  column is scaled */
        ffkeyn("TSCAL", colnum, keyname, status);
        tstatus = 0;
        scaled = 0;

        if (ffgkyd(fptr, keyname, &tscale, NULL, &tstatus) == 0)
        {
            if (tscale != 1.0)
                scaled = 1;    /* yes, this is a scaled column */
        }

        if (scaled && tcode <= TSHORT)
        {
            /* scaled short integer col == float; default format is 14.6G */
            *width = 14;
        }
        else if (scaled && tcode == TLONG)
        {
            /* scaled long integer col == double; default format is 23.15G */
            *width = 23;
        }
        else if (scaled && tcode == TLONGLONG)
        {
            /* scaled long long integer col == double; default format is 23.15G */
            *width = 23;
        }

        else
        {
           ffghdt(fptr, &hdutype, status);  /* get type of table */
           if (hdutype == ASCII_TBL)
           {
              /* parse TFORMn get the display width */
              cptr = dispfmt;
              while(!isdigit((int) *cptr) && *cptr != '\0') /* find 1st digit */
                 cptr++;

              *width = atoi(cptr);
           }
           else
           {
                 /* this is a binary table */
                  if (tcode == TBIT)           /* 'X' */
                     *width = 8;
                  else if (tcode == TBYTE)     /* 'B' */
                     *width = 4;
                  else if (tcode == TSHORT)    /* 'I' */
                     *width = 6;
                  else if (tcode == TLONG)     /* 'J' */
                     *width = 11;
                  else if (tcode == TLONGLONG) /* 'K' */
                     *width = 20;
                  else if (tcode == TFLOAT)    /* 'E' */
                     *width = 14;
                  else if (tcode == TDOUBLE)   /* 'D' */
                     *width = 23;
                  else if (tcode == TCOMPLEX)  /* 'C' */
                     *width = 31;
                  else if (tcode == TDBLCOMPLEX)  /* 'M' */
                     *width = 49;
                  else if (tcode == TLOGICAL)  /* 'L' */
                     *width = 1;
                  else if (tcode == TSTRING)   /* 'A' */
                  {
		    int typecode;
		    long int repeat = 0, rwidth = 0;
		    int gstatus = 0;

		    /* Deal with possible vector string with repeat / width  by parsing
		       the TFORM=rAw keyword */
		    if (ffgtcl(fptr, colnum, &typecode, &repeat, &rwidth, &gstatus) == 0 &&
			rwidth >= 1 && rwidth < repeat) {
		      *width = rwidth;

		    } else {
		      
		      /* Hmmm, we couldn't parse the TFORM keyword by standard, so just do
			 simple parsing */
		      cptr = dispfmt;
		      while(!isdigit((int) *cptr) && *cptr != '\0') 
			cptr++;
		      
		      *width = atoi(cptr);
		    }

                    if (*width < 1)
                         *width = 1;  /* default is at least 1 column */
                  }
            }
        }
    } 
    return(*status);
}